

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O0

void __thiscall
Pl_LZWDecoder::Pl_LZWDecoder
          (Pl_LZWDecoder *this,char *identifier,Pipeline *next,bool early_code_change)

{
  logic_error *this_00;
  bool early_code_change_local;
  Pipeline *next_local;
  char *identifier_local;
  Pl_LZWDecoder *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_LZWDecoder_0058c488;
  this->buf[0] = '\0';
  this->buf[1] = '\0';
  this->buf[2] = '\0';
  this->code_size = 9;
  this->next_char_ = 0;
  this->byte_pos = 0;
  this->bit_pos = 0;
  this->bits_available = 0;
  this->code_change_delta = early_code_change;
  this->eod = false;
  std::vector<Buffer,_std::allocator<Buffer>_>::vector(&this->table);
  this->last_code = 0x100;
  if (next == (Pipeline *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Attempt to create Pl_LZWDecoder with nullptr as next");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

Pl_LZWDecoder::Pl_LZWDecoder(char const* identifier, Pipeline* next, bool early_code_change) :
    Pipeline(identifier, next),
    code_change_delta(early_code_change)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_LZWDecoder with nullptr as next");
    }
}